

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

DataType vkt::sr::anon_unknown_0::getSamplerGatherResultType(DataType samplerType)

{
  undefined4 local_c;
  DataType samplerType_local;
  
  if ((((samplerType - TYPE_SAMPLER_2D < 2) || (samplerType == TYPE_SAMPLER_2D_ARRAY)) ||
      (samplerType - TYPE_SAMPLER_2D_SHADOW < 2)) || (samplerType == TYPE_SAMPLER_2D_ARRAY_SHADOW))
  {
    local_c = TYPE_FLOAT_VEC4;
  }
  else if ((samplerType - TYPE_INT_SAMPLER_2D < 2) || (samplerType == TYPE_INT_SAMPLER_2D_ARRAY)) {
    local_c = TYPE_INT_VEC4;
  }
  else if ((samplerType - TYPE_UINT_SAMPLER_2D < 2) || (samplerType == TYPE_UINT_SAMPLER_2D_ARRAY))
  {
    local_c = TYPE_UINT_VEC4;
  }
  else {
    local_c = TYPE_LAST;
  }
  return local_c;
}

Assistant:

static inline glu::DataType getSamplerGatherResultType (glu::DataType samplerType)
{
	switch (samplerType)
	{
		case glu::TYPE_SAMPLER_2D_SHADOW:
		case glu::TYPE_SAMPLER_2D_ARRAY_SHADOW:
		case glu::TYPE_SAMPLER_CUBE_SHADOW:
		case glu::TYPE_SAMPLER_2D:
		case glu::TYPE_SAMPLER_2D_ARRAY:
		case glu::TYPE_SAMPLER_CUBE:
			return glu::TYPE_FLOAT_VEC4;

		case glu::TYPE_INT_SAMPLER_2D:
		case glu::TYPE_INT_SAMPLER_2D_ARRAY:
		case glu::TYPE_INT_SAMPLER_CUBE:
			return glu::TYPE_INT_VEC4;

		case glu::TYPE_UINT_SAMPLER_2D:
		case glu::TYPE_UINT_SAMPLER_2D_ARRAY:
		case glu::TYPE_UINT_SAMPLER_CUBE:
			return glu::TYPE_UINT_VEC4;

		default:
			DE_ASSERT(false);
			return glu::TYPE_LAST;
	}
}